

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O2

int __thiscall
CP::map_bst<int,_int,_std::less<int>_>::shallowest_leaf
          (map_bst<int,_int,_std::less<int>_> *this,node *n)

{
  node *n_00;
  node *pnVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  node *pnVar5;
  
  iVar2 = 0;
  do {
    while( true ) {
      pnVar5 = n;
      iVar4 = iVar2 + 1;
      if (pnVar5 == (node *)0x0) {
        return iVar2 + -1;
      }
      n_00 = pnVar5->left;
      pnVar1 = pnVar5->right;
      iVar2 = iVar4;
      if (n_00 != (node *)0x0) break;
      n = pnVar1;
      if (pnVar1 == (node *)0x0) goto LAB_0010143d;
    }
    n = n_00;
  } while (pnVar1 == (node *)0x0);
LAB_0010143d:
  iVar2 = shallowest_leaf(this,n_00);
  iVar3 = shallowest_leaf(this,pnVar5->right);
  if (iVar3 < iVar2) {
    iVar2 = iVar3;
  }
  return iVar2 + iVar4;
}

Assistant:

int CP::map_bst<KeyT,MappedT,CompareT>::shallowest_leaf(node* n) {
  if (n == nullptr) return -1;
  if (n->left == nullptr && n->right != nullptr) return 1 + shallowest_leaf(n->right);
  if (n->left != nullptr && n->right == nullptr) return 1 + shallowest_leaf(n->left);
  return 1 + std::min(shallowest_leaf(n->left), shallowest_leaf(n->right));
}